

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O1

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,int radix)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  
  uVar10 = CONCAT44(0,radix);
  lVar7 = 0;
  do {
    if (this->end_ <= this->cursor_ + lVar7) break;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = number;
    bVar5 = SUB161(auVar4 % auVar3,0);
    bVar11 = bVar5 + 0x57;
    if (SUB168(auVar4 % auVar3,0) < 10) {
      bVar11 = bVar5 | 0x30;
    }
    this->cursor_[lVar7] = bVar11;
    lVar7 = lVar7 + 1;
    bVar12 = uVar10 <= number;
    number = number / uVar10;
  } while (bVar12);
  pcVar2 = this->cursor_;
  iVar6 = (int)lVar7;
  pcVar8 = pcVar2 + (long)iVar6 + -1;
  if (pcVar2 < pcVar8 && iVar6 != 0) {
    do {
      pcVar9 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar8;
      *pcVar8 = cVar1;
      pcVar8 = pcVar8 + -1;
      pcVar2 = pcVar9;
    } while (pcVar9 < pcVar8);
  }
  this->cursor_ = this->cursor_ + iVar6;
  return;
}

Assistant:

void AppendUint64(uint64 number, int radix) {
    int i = 0;
    while (cursor_ + i < end_) {
      const int tmp = number % radix;
      number /= radix;
      cursor_[i] = (tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }